

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

_Bool upb_Map_Get(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  char cVar1;
  double dVar2;
  _Bool _Var3;
  upb_StringView *strp;
  size_t sVar4;
  size_t len;
  char ***key_00;
  upb_value local_38;
  double *local_30;
  char **local_28;
  size_t local_20;
  
  local_20 = key.str_val.size;
  local_28 = (char **)key.str_val.data;
  sVar4 = (size_t)map->key_size;
  key_00 = (char ***)local_28;
  if (sVar4 != 0) {
    key_00 = &local_28;
  }
  cVar1 = map->val_size;
  len = local_20;
  if (sVar4 != 0) {
    len = sVar4;
  }
  _Var3 = upb_strtable_lookup2(&map->table,(char *)key_00,len,&local_38);
  if (val != (upb_MessageValue *)0x0 && _Var3) {
    local_30 = (double *)local_38.val;
    if (cVar1 == '\0') {
      dVar2 = *(double *)(local_38.val + 8);
      val->double_val = *(double *)local_38.val;
      (val->str_val).size = (size_t)dVar2;
    }
    else {
      memcpy(val,&local_30,(long)cVar1);
    }
  }
  return _Var3;
}

Assistant:

bool upb_Map_Get(const upb_Map* map, upb_MessageValue key,
                 upb_MessageValue* val) {
  return _upb_Map_Get(map, &key, map->key_size, val, map->val_size);
}